

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffers.h
# Opt level: O1

uint8_t * __thiscall flatbuffers::vector_downward::make_space(vector_downward *this,size_t len)

{
  uint8_t *__src;
  ulong uVar1;
  uint8_t *puVar2;
  uint8_t *puVar3;
  ulong __n;
  ulong uVar4;
  
  puVar3 = this->buf_;
  __src = this->cur_;
  if (__src + -len < puVar3) {
    uVar1 = this->reserved_;
    uVar4 = uVar1 >> 1 & 0xfffffffffffffff8;
    if (uVar4 <= len) {
      uVar4 = len;
    }
    __n = (ulong)(uint)((int)uVar1 + ((int)puVar3 - (int)__src));
    uVar4 = uVar4 + uVar1;
    this->reserved_ = uVar4;
    puVar2 = (uint8_t *)operator_new__(uVar4);
    memcpy(puVar2 + (uVar4 - __n),__src,__n);
    this->cur_ = puVar2 + (uVar4 - __n);
    operator_delete__(puVar3);
    this->buf_ = puVar2;
  }
  puVar3 = this->cur_ + -len;
  this->cur_ = puVar3;
  if ((uint)(((int)this->reserved_ - (int)puVar3) + *(int *)&this->buf_) < 0x7fffffff) {
    return puVar3;
  }
  __assert_fail("size() < (1UL << (sizeof(soffset_t) * 8 - 1)) - 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/AlexStocks[P]flatbuffers/include/flatbuffers/flatbuffers.h"
                ,0xe1,"uint8_t *flatbuffers::vector_downward::make_space(size_t)");
}

Assistant:

uint8_t *make_space(size_t len) {
    if (buf_ > cur_ - len) {
      auto old_size = size();
      reserved_ += std::max(len, growth_policy(reserved_));
      auto new_buf = new uint8_t[reserved_];
      auto new_cur = new_buf + reserved_ - old_size;
      memcpy(new_cur, cur_, old_size);
      cur_ = new_cur;
      delete[] buf_;
      buf_ = new_buf;
    }
    cur_ -= len;
    // Beyond this, signed offsets may not have enough range:
    // (FlatBuffers > 2GB not supported).
    assert(size() < (1UL << (sizeof(soffset_t) * 8 - 1)) - 1);
    return cur_;
  }